

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

void preptypeinfo(rnndb *db,rnntypeinfo *ti,char *prefix,rnnvarinfo *vi,int width,char *file)

{
  char *pcVar1;
  rnnvalue *prVar2;
  char *pcVar3;
  char *pcVar4;
  rnnenum *prVar5;
  char *pcVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  rnnenum *prVar10;
  rnnbitset *prVar11;
  rnnspectype *prVar12;
  rnnvalue **pprVar13;
  rnnvalue *prVar14;
  rnnbitfield **pprVar15;
  rnnbitfield *prVar16;
  int iVar17;
  long lVar18;
  
  pcVar1 = ti->name;
  if (pcVar1 == (char *)0x0) {
    if (ti->bitfieldsnum == 0) {
      if (ti->valsnum != 0) {
        ti->name = "enum";
LAB_00172259:
        ti->type = RNN_TTYPE_INLINE_ENUM;
        goto LAB_00172391;
      }
      if (width == 1) {
        ti->name = "boolean";
LAB_001722a1:
        ti->type = RNN_TTYPE_BOOLEAN;
        goto LAB_00172391;
      }
      ti->name = "hex";
LAB_00172389:
      ti->type = RNN_TTYPE_HEX;
      goto LAB_00172391;
    }
    ti->name = "bitfield";
  }
  else {
    prVar10 = rnn_findenum(db,pcVar1);
    prVar11 = rnn_findbitset(db,pcVar1);
    prVar12 = rnn_findspectype(db,pcVar1);
    if (prVar10 != (rnnenum *)0x0) {
      if (prVar10->isinline == 0) {
        ti->type = RNN_TTYPE_ENUM;
        ti->eenum = prVar10;
      }
      else {
        ti->type = RNN_TTYPE_INLINE_ENUM;
        if (0 < prVar10->valsnum) {
          lVar18 = 0;
          do {
            iVar9 = ti->valsmax;
            if (iVar9 <= ti->valsnum) {
              iVar17 = iVar9 * 2;
              if (iVar9 == 0) {
                iVar17 = 0x10;
              }
              ti->valsmax = iVar17;
              pprVar13 = (rnnvalue **)realloc(ti->vals,(long)iVar17 << 3);
              ti->vals = pprVar13;
            }
            prVar2 = prVar10->vals[lVar18];
            prVar14 = (rnnvalue *)calloc(0x68,1);
            prVar14->name = prVar2->name;
            prVar14->valvalid = prVar2->valvalid;
            prVar14->value = prVar2->value;
            pcVar1 = (prVar2->varinfo).prefixstr;
            pcVar3 = (prVar2->varinfo).varsetstr;
            pcVar4 = (prVar2->varinfo).variantsstr;
            iVar7 = (prVar2->varinfo).dead;
            uVar8 = *(undefined4 *)&(prVar2->varinfo).field_0x1c;
            prVar5 = (prVar2->varinfo).prefenum;
            pcVar6 = (prVar2->varinfo).prefix;
            iVar9 = (prVar2->varinfo).varsetsnum;
            iVar17 = (prVar2->varinfo).varsetsmax;
            (prVar14->varinfo).varsets = (prVar2->varinfo).varsets;
            (prVar14->varinfo).varsetsnum = iVar9;
            (prVar14->varinfo).varsetsmax = iVar17;
            (prVar14->varinfo).prefenum = prVar5;
            (prVar14->varinfo).prefix = pcVar6;
            (prVar14->varinfo).variantsstr = pcVar4;
            (prVar14->varinfo).dead = iVar7;
            *(undefined4 *)&(prVar14->varinfo).field_0x1c = uVar8;
            (prVar14->varinfo).prefixstr = pcVar1;
            (prVar14->varinfo).varsetstr = pcVar3;
            prVar14->file = file;
            iVar9 = ti->valsnum;
            ti->valsnum = iVar9 + 1;
            ti->vals[iVar9] = prVar14;
            lVar18 = lVar18 + 1;
          } while (lVar18 < prVar10->valsnum);
        }
      }
      goto LAB_00172391;
    }
    if (prVar11 != (rnnbitset *)0x0) {
      if (prVar11->isinline == 0) {
        ti->type = RNN_TTYPE_BITSET;
        ti->ebitset = prVar11;
      }
      else {
        ti->type = RNN_TTYPE_INLINE_BITSET;
        if (0 < prVar11->bitfieldsnum) {
          lVar18 = 0;
          do {
            iVar9 = ti->bitfieldsmax;
            if (iVar9 <= ti->bitfieldsnum) {
              iVar17 = iVar9 * 2;
              if (iVar9 == 0) {
                iVar17 = 0x10;
              }
              ti->bitfieldsmax = iVar17;
              pprVar15 = (rnnbitfield **)realloc(ti->bitfields,(long)iVar17 << 3);
              ti->bitfields = pprVar15;
            }
            prVar16 = copybitfield(prVar11->bitfields[lVar18],file);
            iVar9 = ti->bitfieldsnum;
            ti->bitfieldsnum = iVar9 + 1;
            ti->bitfields[iVar9] = prVar16;
            lVar18 = lVar18 + 1;
          } while (lVar18 < prVar11->bitfieldsnum);
        }
      }
      goto LAB_00172391;
    }
    if (prVar12 != (rnnspectype *)0x0) {
      ti->type = RNN_TTYPE_SPECTYPE;
      ti->spectype = prVar12;
      goto LAB_00172391;
    }
    iVar9 = strcmp(pcVar1,"hex");
    if (iVar9 == 0) goto LAB_00172389;
    iVar9 = strcmp(pcVar1,"float");
    if (iVar9 == 0) {
      ti->type = RNN_TTYPE_FLOAT;
      goto LAB_00172391;
    }
    iVar9 = strcmp(pcVar1,"uint");
    if (iVar9 == 0) {
      ti->type = RNN_TTYPE_UINT;
      goto LAB_00172391;
    }
    iVar9 = strcmp(pcVar1,"int");
    if (iVar9 == 0) {
      ti->type = RNN_TTYPE_INT;
      goto LAB_00172391;
    }
    iVar9 = strcmp(pcVar1,"boolean");
    if (iVar9 == 0) goto LAB_001722a1;
    iVar9 = strcmp(pcVar1,"bitfield");
    if (iVar9 != 0) {
      iVar9 = strcmp(pcVar1,"enum");
      if (iVar9 != 0) {
        ti->type = RNN_TTYPE_HEX;
        fprintf(_stderr,"%s: unknown type %s\n",prefix,pcVar1);
        db->estatus = 1;
        goto LAB_00172391;
      }
      goto LAB_00172259;
    }
  }
  ti->type = RNN_TTYPE_INLINE_BITSET;
LAB_00172391:
  if (0 < ti->bitfieldsnum) {
    lVar18 = 0;
    do {
      prepbitfield(db,ti->bitfields[lVar18],prefix,vi);
      lVar18 = lVar18 + 1;
    } while (lVar18 < ti->bitfieldsnum);
  }
  if (0 < ti->valsnum) {
    lVar18 = 0;
    do {
      prepvalue(db,ti->vals[lVar18],prefix,vi);
      lVar18 = lVar18 + 1;
    } while (lVar18 < ti->valsnum);
  }
  return;
}

Assistant:

static void preptypeinfo(struct rnndb *db, struct rnntypeinfo *ti, char *prefix, struct rnnvarinfo *vi, int width, char *file) {
	int i;
	if (ti->name) {
		struct rnnenum *en = rnn_findenum (db, ti->name);
		struct rnnbitset *bs = rnn_findbitset (db, ti->name);
		struct rnnspectype *st = rnn_findspectype (db, ti->name);
		if (en) {
			if (en->isinline) {
				ti->type = RNN_TTYPE_INLINE_ENUM;
				int j;
				for (j = 0; j < en->valsnum; j++)
					ADDARRAY(ti->vals, copyvalue(en->vals[j], file));
			} else {
				ti->type = RNN_TTYPE_ENUM;
				ti->eenum = en;
			}
		} else if (bs) {
			if (bs->isinline) {
				ti->type = RNN_TTYPE_INLINE_BITSET;
				int j;
				for (j = 0; j < bs->bitfieldsnum; j++)
					ADDARRAY(ti->bitfields, copybitfield(bs->bitfields[j], file));
			} else {
				ti->type = RNN_TTYPE_BITSET;
				ti->ebitset = bs;
			}
		} else if (st) {
			ti->type = RNN_TTYPE_SPECTYPE;
			ti->spectype = st;
		} else if (!strcmp(ti->name, "hex")) {
			ti->type = RNN_TTYPE_HEX;
		} else if (!strcmp(ti->name, "float")) {
			ti->type = RNN_TTYPE_FLOAT;
		} else if (!strcmp(ti->name, "uint")) {
			ti->type = RNN_TTYPE_UINT;
		} else if (!strcmp(ti->name, "int")) {
			ti->type = RNN_TTYPE_INT;
		} else if (!strcmp(ti->name, "boolean")) {
			ti->type = RNN_TTYPE_BOOLEAN;
		} else if (!strcmp(ti->name, "bitfield")) {
			ti->type = RNN_TTYPE_INLINE_BITSET;
		} else if (!strcmp(ti->name, "enum")) {
			ti->type = RNN_TTYPE_INLINE_ENUM;
		} else {
			ti->type = RNN_TTYPE_HEX;
			fprintf (stderr, "%s: unknown type %s\n", prefix, ti->name);
			db->estatus = 1;
		}
	} else if (ti->bitfieldsnum) {
		ti->name = "bitfield";
		ti->type = RNN_TTYPE_INLINE_BITSET;
	} else if (ti->valsnum) {
		ti->name = "enum";
		ti->type = RNN_TTYPE_INLINE_ENUM;
	} else if (width == 1) {
		ti->name = "boolean";
		ti->type = RNN_TTYPE_BOOLEAN;
	} else {
		ti->name = "hex";
		ti->type = RNN_TTYPE_HEX;
	}
	for (i = 0; i < ti->bitfieldsnum; i++)
		prepbitfield(db,  ti->bitfields[i], prefix, vi);
	for (i = 0; i < ti->valsnum; i++)
		prepvalue(db, ti->vals[i], prefix, vi);
}